

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int wait_for_edge(int pi,uint user_gpio,uint edge,double timeout)

{
  bool bVar1;
  int iVar2;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double due;
  int id;
  int triggered;
  void *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = 0;
  if (((in_EDI < 0) || (0x1f < in_EDI)) || (gPiInUse[in_EDI] == 0)) {
    local_4 = -0x7db;
  }
  else if (0.0 < in_XMM0_Qa) {
    dVar3 = time_time();
    dVar3 = dVar3 + in_XMM0_Qa;
    iVar2 = callback_ex(local_4,in_stack_ffffffffffffffe0,(uint)((ulong)dVar3 >> 0x20),
                        (CBFuncEx_t)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    while( true ) {
      bVar1 = false;
      if (local_4 == 0) {
        dVar4 = time_time();
        bVar1 = dVar4 < dVar3;
      }
      if (!bVar1) break;
      time_sleep((double)CONCAT44(local_4,iVar2));
    }
    callback_cancel(in_stack_ffffffffffffffd0);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int wait_for_edge(int pi, unsigned user_gpio, unsigned edge, double timeout)
{
   int triggered = 0;
   int id;
   double due;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   if (timeout <= 0.0) return 0;

   due = time_time() + timeout;

   id = callback_ex(pi, user_gpio, edge, _wfe, &triggered);

   while (!triggered && (time_time() < due)) time_sleep(0.05);

   callback_cancel(id);

   return triggered;
}